

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

Result<kernel::ChainstateManagerOpts> *
validation_chainstatemanager_tests::SetOptsFromArgs<kernel::ChainstateManagerOpts>
          (ArgsManager *args_man,ChainstateManagerOpts *opts,
          vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  initializer_list<const_char_*> __l;
  undefined1 uVar1;
  bool bVar2;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  Result<void> result;
  string error;
  ChainstateManagerOpts *in_stack_fffffffffffffd48;
  T *in_stack_fffffffffffffd50;
  Error *error_00;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffd58;
  Result<kernel::ChainstateManagerOpts> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  ChainstateManagerOpts *pCVar3;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__lhs;
  char local_219 [25];
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  Options *in_stack_fffffffffffffed0;
  ArgsManager *in_stack_fffffffffffffed8;
  Error local_70;
  undefined8 local_10;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_8;
  
  local_8._M_head_impl =
       *(_Impl **)
        &((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
           *)(in_FS_OFFSET + 0x28))->
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ;
  local_10 = (long)"dec_ignore == in_ignore" + 0x11;
  __lhs = local_219;
  __rhs = in_RDI;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_fffffffffffffd48);
  __l._M_len = (size_type)__lhs;
  __l._M_array = (iterator)__rhs;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_RDI,__l,
             (allocator_type *)in_RDX);
  Cat<std::vector<char_const*,std::allocator<char_const*>>>
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_RDX,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffd58);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_fffffffffffffd48);
  pCVar3 = (ChainstateManagerOpts *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string(in_stack_fffffffffffffd60);
  this = (Result<kernel::ChainstateManagerOpts> *)&stack0xfffffffffffffe00;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffd48);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::data
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffd48);
  uVar1 = ArgsManager::ParseParameters
                    ((ArgsManager *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                     (char **)in_stack_fffffffffffffe08,(string *)in_stack_fffffffffffffe00);
  if ((bool)uVar1) {
    ::node::ApplyArgsManOptions(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    bVar2 = util::Result::operator_cast_to_bool((Result<void> *)in_stack_fffffffffffffd48);
    if (bVar2) {
      kernel::ChainstateManagerOpts::ChainstateManagerOpts
                ((ChainstateManagerOpts *)CONCAT17(uVar1,in_stack_fffffffffffffd78),pCVar3);
      util::Result<kernel::ChainstateManagerOpts>::Result(this,in_stack_fffffffffffffd50);
      kernel::ChainstateManagerOpts::~ChainstateManagerOpts(in_stack_fffffffffffffd48);
    }
    else {
      util::ErrorString<void>((Result<void> *)in_RDX);
      util::Result<kernel::ChainstateManagerOpts>::Result(this,(Error *)in_stack_fffffffffffffd50);
      util::Error::~Error((Error *)in_stack_fffffffffffffd48);
    }
    util::Result<void>::~Result((Result<void> *)in_stack_fffffffffffffd48);
  }
  else {
    error_00 = &local_70;
    std::operator+(__lhs,__rhs);
    Untranslated(in_RDX);
    util::Result<kernel::ChainstateManagerOpts>::Result(this,error_00);
    util::Error::~Error((Error *)in_stack_fffffffffffffd48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd48);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this);
  if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
    return (Result<kernel::ChainstateManagerOpts> *)__rhs;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<Options> SetOptsFromArgs(ArgsManager& args_man, Options opts,
                                      const std::vector<const char*>& args)
{
    const auto argv{Cat({"ignore"}, args)};
    std::string error{};
    if (!args_man.ParseParameters(argv.size(), argv.data(), error)) {
        return util::Error{Untranslated("ParseParameters failed with error: " + error)};
    }
    const auto result{node::ApplyArgsManOptions(args_man, opts)};
    if (!result) return util::Error{util::ErrorString(result)};
    return opts;
}